

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

substr c4::decode_code_point(substr out,csubstr code_point)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  ulong uVar4;
  size_t len_;
  ulong uVar5;
  int iVar6;
  char *pcVar7;
  uint32_t code;
  ulong buflen;
  substr sVar8;
  substr local_38;
  
  uVar5 = code_point.len;
  pcVar7 = code_point.str;
  buflen = out.len;
  if (buflen < 4) {
    decode_code_point();
  }
  if (uVar5 < 2) {
    if (uVar5 == 0) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          sVar8 = (substr)(*pcVar2)();
          return sVar8;
        }
      }
      handle_error(0x1fce74,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x452c,"code_point.len > 0");
    }
  }
  else if (*pcVar7 == 'U') {
    if (pcVar7[1] == '+') {
      if (((byte)s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          sVar8 = (substr)(*pcVar2)();
          return sVar8;
        }
      }
      handle_error(0x1fce74,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x4526,"!code_point.begins_with(\"U+\")");
    }
  }
  else if (*pcVar7 == '\\') {
    if (pcVar7[1] == 'x') {
      if (((byte)s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          sVar8 = (substr)(*pcVar2)();
          return sVar8;
        }
      }
      handle_error(0x1fce74,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x4527,"!code_point.begins_with(\"\\\\x\")");
    }
    if (pcVar7[1] == 'u') {
      if (((byte)s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          sVar8 = (substr)(*pcVar2)();
          return sVar8;
        }
      }
      handle_error(0x1fce74,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x4528,"!code_point.begins_with(\"\\\\u\")");
    }
    if (pcVar7[1] == 'U') {
      if (((byte)s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          sVar8 = (substr)(*pcVar2)();
          return sVar8;
        }
      }
      handle_error(0x1fce74,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x4529,"!code_point.begins_with(\"\\\\U\")");
    }
  }
  if (*pcVar7 == '0') {
    decode_code_point();
  }
  if (8 < uVar5) {
    decode_code_point();
  }
  uVar4 = 0;
  code = 0;
  while( true ) {
    cVar1 = pcVar7[uVar4];
    iVar6 = -0x30;
    if (((9 < (byte)(cVar1 - 0x30U)) && (iVar6 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) &&
       (iVar6 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) break;
    code = code * 0x10 + iVar6 + (int)cVar1;
    uVar4 = uVar4 + 1;
    if (uVar5 == uVar4) {
      len_ = decode_code_point((uint8_t *)out.str,buflen,code);
      if (len_ <= buflen) {
        basic_substring<char>::basic_substring(&local_38,out.str,len_);
        return local_38;
      }
      if (((byte)s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          sVar8 = (substr)(*pcVar2)();
          return sVar8;
        }
      }
      handle_error(0x1fce74,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      sVar8 = (substr)(*pcVar2)();
      return sVar8;
    }
  }
  handle_error(0x1fce74,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x452e,"read_hex(code_point, &code_point_val)");
}

Assistant:

substr decode_code_point(substr out, csubstr code_point)
{
    C4_ASSERT(out.len >= 4);
    C4_ASSERT(!code_point.begins_with("U+"));
    C4_ASSERT(!code_point.begins_with("\\x"));
    C4_ASSERT(!code_point.begins_with("\\u"));
    C4_ASSERT(!code_point.begins_with("\\U"));
    C4_ASSERT(!code_point.begins_with('0'));
    C4_ASSERT(code_point.len <= 8);
    C4_ASSERT(code_point.len > 0);
    uint32_t code_point_val;
    C4_CHECK(read_hex(code_point, &code_point_val));
    size_t ret = decode_code_point((uint8_t*)out.str, out.len, code_point_val);
    C4_ASSERT(ret <= 4);
    return out.first(ret);
}